

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O1

string * __thiscall
bredis::bredis_category::message_abi_cxx11_
          (string *__return_storage_ptr__,bredis_category *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Wrong introduction";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Parser error";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Cannot convert count to number";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Unacceptable count value";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Terminator for bulk string not found";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown protocol error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const {
        auto ec = static_cast<bredis_errors>(ev);
        switch (ec) {
        case bredis_errors::wrong_intoduction:
            return "Wrong introduction";
        case bredis_errors::parser_error:
            return "Parser error";
        case bredis_errors::count_conversion:
            return "Cannot convert count to number";
        case bredis_errors::count_range:
            return "Unacceptable count value";
        case bredis_errors::bulk_terminator:
            return "Terminator for bulk string not found";
        }
        return "Unknown protocol error";
    }